

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

void __thiscall pg::PSISolver::compute_vals_seq(PSISolver *this)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> q;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(first_in,0xff,((this->super_Solver).game)->n_vertices << 2);
  local_4c = 0;
  while( true ) {
    pvVar1 = first_in;
    lVar6 = done;
    lVar4 = (long)local_4c;
    if (((this->super_Solver).game)->n_vertices <= lVar4) break;
    if (*(int *)(done + lVar4 * 4) != 3) {
      lVar5 = (long)*(int *)(str + lVar4 * 4);
      if ((lVar5 == -1) || (*(int *)(halt + lVar5 * 4) != 0)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_48,&local_4c);
      }
      else {
        *(undefined4 *)(next_in + lVar4 * 4) = *(undefined4 *)((long)first_in + lVar5 * 4);
        *(int *)((long)pvVar1 + lVar5 * 4) = local_4c;
        if (*(int *)(lVar6 + (long)local_4c * 4) != 2) {
          *(undefined4 *)(lVar6 + (long)local_4c * 4) = 2;
        }
      }
    }
    local_4c = local_4c + 1;
  }
  while (local_48._M_impl.super__Vector_impl_data._M_start !=
         local_48._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = (long)local_48._M_impl.super__Vector_impl_data._M_finish[-1];
    local_48._M_impl.super__Vector_impl_data._M_finish =
         local_48._M_impl.super__Vector_impl_data._M_finish + -1;
    pvVar1 = (void *)(val + (int)k * lVar6 * 4);
    iVar2 = *(int *)(str + lVar6 * 4);
    if (((long)iVar2 == -1) || (*(int *)(halt + (long)iVar2 * 4) != 0)) {
      memset(pvVar1,0,(ulong)k << 2);
    }
    else {
      memcpy(pvVar1,(void *)(val + (long)(int)(iVar2 * k) * 4),(ulong)k << 2);
    }
    piVar3 = (int *)((long)pvVar1 + (long)((this->super_Solver).game)->_priority[lVar6] * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(done + lVar6 * 4) = 1;
    piVar3 = (int *)(lVar6 * 4 + (long)first_in);
    while (local_4c = *piVar3, local_4c != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_48,&local_4c);
      piVar3 = (int *)((long)local_4c * 4 + next_in);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void
PSISolver::compute_vals_seq(void)
{
    std::vector<int> q;

    memset(first_in, -1, sizeof(int[nodecount()]));

    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 3) continue; // disabled
        int s = str[n];
        if (s == -1 or halt[s]) { // either we halt or the dummy halts...
            // assuming that valuation is properly initialized...
            q.push_back(n);
        } else {
            next_in[n] = first_in[s];
            first_in[s] = n;
            if (done[n] != 2) done[n] = 2; // mark "2", if not updated, then it's on a cycle
        }
    }

    while (!q.empty()) {
        int v = q.back();
        q.pop_back();

        // set valuation
        int *val_v = val + k*v;
        int s = str[v];
        if (s == -1 or halt[s]) memset(val_v, 0, sizeof(int[k]));
        else memcpy(val_v, val+k*s, sizeof(int[k]));
        val_v[priority(v)]++;
        done[v] = 1; // mark "1" as processed and not on a cycle

        // add predecessors
        int from = first_in[v];
        while (from != -1) {
            q.push_back(from);
            from = next_in[from];
        }
    }
}